

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O1

Abc_Obj_t * Abc_NtkCreateObj(Abc_Ntk_t *pNtk,Abc_ObjType_t Type)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  void **ppvVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  
  pAVar3 = Abc_ObjAlloc(pNtk,Type);
  pVVar6 = pNtk->vObjs;
  uVar1 = pVVar6->nSize;
  pAVar3->Id = uVar1;
  uVar2 = pVVar6->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar4;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_0086439e;
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
      }
      pVVar6->pArray = ppvVar4;
    }
    pVVar6->nCap = iVar5;
  }
LAB_0086439e:
  iVar5 = pVVar6->nSize;
  pVVar6->nSize = iVar5 + 1;
  pVVar6->pArray[iVar5] = pAVar3;
  pNtk->nObjCounts[Type] = pNtk->nObjCounts[Type] + 1;
  pNtk->nObjs = pNtk->nObjs + 1;
  switch((ulong)Type) {
  case 0:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x7a,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  case 1:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x7d,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  case 2:
    pVVar6 = pNtk->vPis;
    uVar1 = pVVar6->nCap;
    if (pVVar6->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pVVar6->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
        }
        pVVar6->pArray = ppvVar4;
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar1 * 2;
        if (iVar5 <= (int)uVar1) goto LAB_008644dc;
        if (pVVar6->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
        }
        pVVar6->pArray = ppvVar4;
      }
      pVVar6->nCap = iVar5;
    }
LAB_008644dc:
    iVar5 = pVVar6->nSize;
    pVVar6->nSize = iVar5 + 1;
    pVVar6->pArray[iVar5] = pAVar3;
    pVVar6 = pNtk->vCis;
    goto LAB_0086451b;
  case 3:
    pVVar6 = pNtk->vPos;
    uVar1 = pVVar6->nCap;
    if (pVVar6->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pVVar6->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
        }
        pVVar6->pArray = ppvVar4;
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar1 * 2;
        if (iVar5 <= (int)uVar1) goto LAB_00864504;
        if (pVVar6->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
        }
        pVVar6->pArray = ppvVar4;
      }
      pVVar6->nCap = iVar5;
    }
LAB_00864504:
    iVar5 = pVVar6->nSize;
    pVVar6->nSize = iVar5 + 1;
    pVVar6->pArray[iVar5] = pAVar3;
    pVVar6 = pNtk->vCos;
    goto LAB_0086451b;
  case 4:
    pVVar6 = pNtk->vCos;
    break;
  case 5:
    pVVar6 = pNtk->vCis;
    break;
  case 6:
  case 7:
    return pAVar3;
  case 8:
    (pAVar3->field_5).pData = (void *)0x0;
  case 9:
  case 10:
    pVVar6 = pNtk->vBoxes;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x99,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  }
  if (pVVar6 == (Vec_Ptr_t *)0x0) {
    return pAVar3;
  }
LAB_0086451b:
  uVar1 = pVVar6->nCap;
  if (pVVar6->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar4;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_00864586;
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
      }
      pVVar6->pArray = ppvVar4;
    }
    pVVar6->nCap = iVar5;
  }
LAB_00864586:
  iVar5 = pVVar6->nSize;
  pVVar6->nSize = iVar5 + 1;
  pVVar6->pArray[iVar5] = pAVar3;
  return pAVar3;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateObj( Abc_Ntk_t * pNtk, Abc_ObjType_t Type )
{
    Abc_Obj_t * pObj;
    // create new object, assign ID, and add to the array
    pObj = Abc_ObjAlloc( pNtk, Type );
    pObj->Id = pNtk->vObjs->nSize;
    Vec_PtrPush( pNtk->vObjs, pObj );
    pNtk->nObjCounts[Type]++;
    pNtk->nObjs++;
    // perform specialized operations depending on the object type
    switch (Type)
    {
        case ABC_OBJ_NONE:   
            assert(0); 
            break;
        case ABC_OBJ_CONST1: 
            assert(0); 
            break;
        case ABC_OBJ_PI:
//            pObj->iTemp = Vec_PtrSize(pNtk->vCis);
            Vec_PtrPush( pNtk->vPis, pObj );
            Vec_PtrPush( pNtk->vCis, pObj );
            break;
        case ABC_OBJ_PO:     
//            pObj->iTemp = Vec_PtrSize(pNtk->vCos);
            Vec_PtrPush( pNtk->vPos, pObj );
            Vec_PtrPush( pNtk->vCos, pObj );
            break;
        case ABC_OBJ_BI:     
            if ( pNtk->vCos ) Vec_PtrPush( pNtk->vCos, pObj );
            break;
        case ABC_OBJ_BO:     
            if ( pNtk->vCis ) Vec_PtrPush( pNtk->vCis, pObj );
            break;
        case ABC_OBJ_NET:  
        case ABC_OBJ_NODE: 
            break;
        case ABC_OBJ_LATCH:     
            pObj->pData = (void *)ABC_INIT_NONE;
        case ABC_OBJ_WHITEBOX:     
        case ABC_OBJ_BLACKBOX:     
            if ( pNtk->vBoxes ) Vec_PtrPush( pNtk->vBoxes, pObj );
            break;
        default:
            assert(0); 
            break;
    }
    return pObj;
}